

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
* __thiscall
wallet::CWallet::GetActiveScriptPubKeyMans
          (set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *__return_storage_ptr__,CWallet *this)

{
  _Rb_tree_header *p_Var1;
  bool internal;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  OutputType t;
  ScriptPubKeyMan *local_48;
  OutputType local_40;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a = 0x100;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    internal = *(bool *)((long)&local_3a + lVar2);
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      local_40 = *(OutputType *)((long)OUTPUT_TYPES._M_elems + lVar3);
      local_48 = GetScriptPubKeyMan(this,&local_40,internal);
      if (local_48 != (ScriptPubKeyMan *)0x0) {
        std::
        _Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
        ::_M_insert_unique<wallet::ScriptPubKeyMan*const&>
                  ((_Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
                    *)__return_storage_ptr__,&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<ScriptPubKeyMan*> CWallet::GetActiveScriptPubKeyMans() const
{
    std::set<ScriptPubKeyMan*> spk_mans;
    for (bool internal : {false, true}) {
        for (OutputType t : OUTPUT_TYPES) {
            auto spk_man = GetScriptPubKeyMan(t, internal);
            if (spk_man) {
                spk_mans.insert(spk_man);
            }
        }
    }
    return spk_mans;
}